

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderAdjacency.cpp
# Opt level: O3

IterateResult __thiscall glcts::GeometryShaderAdjacency::iterate(GeometryShaderAdjacency *this)

{
  GLenum GVar1;
  AdjacencyTestData *pAVar2;
  int iVar3;
  deUint32 dVar4;
  GLuint GVar5;
  undefined4 extraout_var;
  long lVar7;
  ostream *poVar8;
  size_t sVar9;
  GLfloat *pGVar10;
  ulong uVar11;
  float fVar12;
  float fVar13;
  stringstream sstreamResult;
  stringstream sstreamExpected;
  long *local_4e8;
  long local_4d8 [2];
  long local_4c8;
  undefined1 local_4c0 [8];
  _func_int **local_4b8;
  ios_base local_448 [264];
  stringstream local_340 [16];
  undefined1 local_330 [376];
  stringstream local_1b8 [16];
  undefined1 local_1a8 [376];
  long lVar6;
  
  initTest(this);
  iVar3 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar6 = CONCAT44(extraout_var,iVar3);
  (**(code **)(lVar6 + 0xd8))(this->m_vao_id);
  dVar4 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar4,"Error binding vertex array object!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAdjacency.cpp"
                  ,0x163);
  if (this->m_test_data->m_gs_code == (char *)0x0) {
    (**(code **)(lVar6 + 0x48))(0x8c8e,0,this->m_geometry_bo_id);
  }
  else {
    (**(code **)(lVar6 + 0x48))(0x8c8e,0,this->m_adjacency_geometry_bo_id);
    (**(code **)(lVar6 + 0x48))(0x8c8e,1,this->m_geometry_bo_id);
  }
  dVar4 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar4,"Error configuring transform feedback buffer binding points!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAdjacency.cpp"
                  ,0x170);
  (**(code **)(lVar6 + 0x40))(0x8892,this->m_vertex_data_bo_id);
  GVar5 = (**(code **)(lVar6 + 0x780))(this->m_po_id,"position_data");
  this->m_position_attribute_location = GVar5;
  (**(code **)(lVar6 + 0x19f0))(GVar5,this->m_components_input,0x1406,0,0,0);
  (**(code **)(lVar6 + 0x610))(this->m_position_attribute_location);
  dVar4 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar4,"Error setting vertex attribute array for position_data attribute",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAdjacency.cpp"
                  ,0x176);
  if (this->m_test_data->m_index_data_bo_size != 0) {
    (**(code **)(lVar6 + 0x40))(0x8893,this->m_index_data_bo_id);
  }
  dVar4 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar4,"Error binding index data buffer",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAdjacency.cpp"
                  ,0x17d);
  (**(code **)(lVar6 + 0x5e0))(0x8c89);
  (**(code **)(lVar6 + 0x1680))(this->m_po_id);
  (**(code **)(lVar6 + 0x30))(this->m_test_data->m_tf_mode);
  pAVar2 = this->m_test_data;
  GVar1 = pAVar2->m_mode;
  if (pAVar2->m_index_data_bo_size == 0) {
    (**(code **)(lVar6 + 0x538))(GVar1,0);
  }
  else {
    (**(code **)(lVar6 + 0x568))
              (GVar1,pAVar2->m_n_vertices <<
                     (GVar1 != (this->super_TestCaseBase).m_glExtTokens.TRIANGLE_STRIP_ADJACENCY &&
                     GVar1 != (this->super_TestCaseBase).m_glExtTokens.LINE_STRIP_ADJACENCY),0x1405,
               0);
  }
  dVar4 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar4,"Error while trying to render",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAdjacency.cpp"
                  ,0x193);
  (**(code **)(lVar6 + 0x4e8))(0x8c89);
  (**(code **)(lVar6 + 0x638))();
  local_4c8 = lVar6;
  if (this->m_test_data->m_gs_code != (char *)0x0) {
    (**(code **)(lVar6 + 0x40))(0x8c8e,this->m_adjacency_geometry_bo_id);
    lVar7 = (**(code **)(lVar6 + 0xd00))(0x8c8e,0,this->m_test_data->m_geometry_bo_size,1);
    dVar4 = (**(code **)(lVar6 + 0x800))();
    glu::checkError(dVar4,"Error when mapping data to client space",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAdjacency.cpp"
                    ,0x1a2);
    std::__cxx11::stringstream::stringstream(local_1b8);
    std::__cxx11::stringstream::stringstream(local_340);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_330,"[",1);
    if (3 < this->m_test_data->m_geometry_bo_size) {
      pGVar10 = this->m_test_data->m_expected_adjacency_geometry;
      uVar11 = 0;
      do {
        poVar8 = std::ostream::_M_insert<double>((double)pGVar10[uVar11]);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,", ",2);
        poVar8 = std::ostream::_M_insert<double>((double)*(float *)(lVar7 + uVar11 * 4));
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,", ",2);
        pGVar10 = this->m_test_data->m_expected_adjacency_geometry;
        fVar12 = *(float *)(lVar7 + uVar11 * 4) - pGVar10[uVar11];
        fVar13 = -fVar12;
        if (-fVar12 <= fVar12) {
          fVar13 = fVar12;
        }
        if (this->m_epsilon <= fVar13) {
          (**(code **)(local_4c8 + 0x1670))(0x8c8e);
          local_4c0 = (undefined1  [8])
                      ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_4b8);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_4b8,"At [",4);
          std::ostream::_M_insert<unsigned_long>((ulong)&local_4b8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_4b8,
                     "] position adjacency buffer position Reference value is different than the rendered data (epsilon "
                     ,0x62);
          std::ostream::_M_insert<double>((double)this->m_epsilon);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_4b8," )",2);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_4b8," (",2);
          std::ostream::_M_insert<double>
                    ((double)this->m_test_data->m_expected_adjacency_geometry[uVar11]);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_4b8,") vs ",5);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_4b8,"(",1);
          std::ostream::_M_insert<double>((double)*(float *)(lVar7 + uVar11 * 4));
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_4b8,")",1);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_4c0,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_4b8);
          std::ios_base::~ios_base(local_448);
          tcu::TestContext::setTestResult
                    ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx,
                     QP_TEST_RESULT_FAIL,"Fail");
          goto LAB_00d78bbe;
        }
        uVar11 = uVar11 + 1;
      } while (uVar11 < this->m_test_data->m_geometry_bo_size >> 2);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"]",1);
    lVar6 = local_4c8;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_330,"]",1);
    local_4c0 = (undefined1  [8])
                ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_4b8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_4b8,"Adjacency Expected: ",0x14);
    std::__cxx11::stringbuf::str();
    iVar3 = (int)(ostringstream *)&local_4b8;
    if (local_4e8 == (long *)0x0) {
      std::ios::clear((int)local_4b8[-3] + iVar3);
    }
    else {
      sVar9 = strlen((char *)local_4e8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_4b8,(char *)local_4e8,sVar9);
    }
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_4c0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    if (local_4e8 != local_4d8) {
      operator_delete(local_4e8,local_4d8[0] + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_4b8);
    std::ios_base::~ios_base(local_448);
    local_4c0 = (undefined1  [8])
                ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_4b8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_4b8,"Adjacency Result:  ",0x13);
    std::__cxx11::stringbuf::str();
    if (local_4e8 == (long *)0x0) {
      std::ios::clear((int)local_4b8[-3] + iVar3);
    }
    else {
      sVar9 = strlen((char *)local_4e8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_4b8,(char *)local_4e8,sVar9);
    }
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_4c0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    if (local_4e8 != local_4d8) {
      operator_delete(local_4e8,local_4d8[0] + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_4b8);
    std::ios_base::~ios_base(local_448);
    (**(code **)(lVar6 + 0x1670))(0x8c8e);
    std::__cxx11::stringstream::~stringstream(local_340);
    std::ios_base::~ios_base((ios_base *)(local_330 + 0x70));
    std::__cxx11::stringstream::~stringstream(local_1b8);
    std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  }
  (**(code **)(lVar6 + 0x40))(0x8c8e,this->m_geometry_bo_id);
  lVar7 = (**(code **)(lVar6 + 0xd00))(0x8c8e,0,this->m_test_data->m_geometry_bo_size,1);
  dVar4 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar4,"Error when mapping data to client space",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAdjacency.cpp"
                  ,0x1cc);
  std::__cxx11::stringstream::stringstream(local_1b8);
  std::__cxx11::stringstream::stringstream(local_340);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_330,"[",1);
  if (3 < this->m_test_data->m_geometry_bo_size) {
    pGVar10 = this->m_test_data->m_expected_geometry;
    uVar11 = 0;
    do {
      poVar8 = std::ostream::_M_insert<double>((double)pGVar10[uVar11]);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,", ",2);
      poVar8 = std::ostream::_M_insert<double>((double)*(float *)(lVar7 + uVar11 * 4));
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,", ",2);
      pGVar10 = this->m_test_data->m_expected_geometry;
      fVar12 = *(float *)(lVar7 + uVar11 * 4) - pGVar10[uVar11];
      fVar13 = -fVar12;
      if (-fVar12 <= fVar12) {
        fVar13 = fVar12;
      }
      if (this->m_epsilon <= fVar13) {
        (**(code **)(local_4c8 + 0x1670))(0x8c8e);
        local_4c0 = (undefined1  [8])
                    ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_4b8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_4b8,"At [",4);
        std::ostream::_M_insert<unsigned_long>((ulong)&local_4b8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_4b8,
                   "] position geometry buffer position Reference value is different than the rendered data (epsilon "
                   ,0x61);
        std::ostream::_M_insert<double>((double)this->m_epsilon);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_4b8," )",2);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_4b8," (",2);
        std::ostream::_M_insert<double>((double)this->m_test_data->m_expected_geometry[uVar11]);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_4b8,") vs ",5);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_4b8,"(",1);
        std::ostream::_M_insert<double>((double)*(float *)(lVar7 + uVar11 * 4));
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_4b8,")",1);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_4c0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_4b8);
        std::ios_base::~ios_base(local_448);
        tcu::TestContext::setTestResult
                  ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx,
                   QP_TEST_RESULT_FAIL,"Fail");
        goto LAB_00d78bbe;
      }
      uVar11 = uVar11 + 1;
    } while (uVar11 < this->m_test_data->m_geometry_bo_size >> 2);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"]",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_330,"]",1);
  local_4c0 = (undefined1  [8])
              ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_4b8);
  lVar6 = local_4c8;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_4b8,"Expected: ",10);
  std::__cxx11::stringbuf::str();
  iVar3 = (int)(ostringstream *)&local_4b8;
  if (local_4e8 == (long *)0x0) {
    std::ios::clear((int)local_4b8[-3] + iVar3);
  }
  else {
    sVar9 = strlen((char *)local_4e8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_4b8,(char *)local_4e8,sVar9);
  }
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_4c0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  if (local_4e8 != local_4d8) {
    operator_delete(local_4e8,local_4d8[0] + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_4b8);
  std::ios_base::~ios_base(local_448);
  local_4c0 = (undefined1  [8])
              ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_4b8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_4b8,"Result:  ",9);
  std::__cxx11::stringbuf::str();
  if (local_4e8 == (long *)0x0) {
    std::ios::clear((int)local_4b8[-3] + iVar3);
  }
  else {
    sVar9 = strlen((char *)local_4e8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_4b8,(char *)local_4e8,sVar9);
  }
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_4c0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  if (local_4e8 != local_4d8) {
    operator_delete(local_4e8,local_4d8[0] + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_4b8);
  std::ios_base::~ios_base(local_448);
  (**(code **)(lVar6 + 0x1670))(0x8c8e);
  tcu::TestContext::setTestResult
            ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
             "Pass");
LAB_00d78bbe:
  std::__cxx11::stringstream::~stringstream(local_340);
  std::ios_base::~ios_base((ios_base *)(local_330 + 0x70));
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult GeometryShaderAdjacency::iterate(void)
{
	initTest();

	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/** Bind a vertex array object */
	gl.bindVertexArray(m_vao_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error binding vertex array object!");

	/* Bind buffer objects used as data store for transform feedback to TF binding points*/
	if (m_test_data.m_gs_code)
	{
		gl.bindBufferBase(GL_TRANSFORM_FEEDBACK_BUFFER, 0, m_adjacency_geometry_bo_id);
		gl.bindBufferBase(GL_TRANSFORM_FEEDBACK_BUFFER, 1, m_geometry_bo_id);
	}
	else
	{
		gl.bindBufferBase(GL_TRANSFORM_FEEDBACK_BUFFER, 0, m_geometry_bo_id);
	}

	GLU_EXPECT_NO_ERROR(gl.getError(), "Error configuring transform feedback buffer binding points!");

	gl.bindBuffer(GL_ARRAY_BUFFER, m_vertex_data_bo_id);
	m_position_attribute_location = gl.getAttribLocation(m_po_id, "position_data");
	gl.vertexAttribPointer(m_position_attribute_location, m_components_input, GL_FLOAT, GL_FALSE, 0, 0);
	gl.enableVertexAttribArray(m_position_attribute_location);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error setting vertex attribute array for position_data attribute");

	/* bind index buffer */
	if (m_test_data.m_index_data_bo_size > 0)
	{
		gl.bindBuffer(GL_ELEMENT_ARRAY_BUFFER, m_index_data_bo_id);
	}
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error binding index data buffer");

	/* Configure program */
	gl.enable(GL_RASTERIZER_DISCARD);
	gl.useProgram(m_po_id);
	gl.beginTransformFeedback(m_test_data.m_tf_mode);

	glw::GLuint nVertices = m_test_data.m_n_vertices * ((m_test_data.m_mode == m_glExtTokens.LINE_STRIP_ADJACENCY ||
														 m_test_data.m_mode == m_glExtTokens.TRIANGLE_STRIP_ADJACENCY) ?
															1 :
															2 /* include adjacency info */);

	/* Use glDrawElements if data is indicied */
	if (m_test_data.m_index_data_bo_size > 0)
	{
		gl.drawElements(m_test_data.m_mode, nVertices, GL_UNSIGNED_INT, 0);
	}
	/* Use glDrawArrays if data is non indicied */
	else
	{
		gl.drawArrays(m_test_data.m_mode, 0, nVertices);
	}
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error while trying to render");

	gl.disable(GL_RASTERIZER_DISCARD);
	gl.endTransformFeedback();

	/* Map result buffer objects into client space */
	float* result_adjacency_geometry_ptr = 0;
	float* result_geometry_ptr			 = 0;

	/* If gs is available read adjacency data using TF and compare with expected data*/
	if (m_test_data.m_gs_code)
	{
		gl.bindBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, m_adjacency_geometry_bo_id);
		result_adjacency_geometry_ptr =
			(float*)gl.mapBufferRange(GL_TRANSFORM_FEEDBACK_BUFFER, 0, m_test_data.m_geometry_bo_size, GL_MAP_READ_BIT);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Error when mapping data to client space");

		std::stringstream sstreamExpected;
		std::stringstream sstreamResult;
		sstreamExpected << "[";
		sstreamResult << "[";

		for (unsigned int n = 0; n < m_test_data.m_geometry_bo_size / sizeof(float); ++n)
		{
			sstreamExpected << m_test_data.m_expected_adjacency_geometry[n] << ", ";
			sstreamResult << result_adjacency_geometry_ptr[n] << ", ";

			if (de::abs(result_adjacency_geometry_ptr[n] - m_test_data.m_expected_adjacency_geometry[n]) >= m_epsilon)
			{
				gl.unmapBuffer(GL_TRANSFORM_FEEDBACK_BUFFER);

				m_testCtx.getLog() << tcu::TestLog::Message << "At [" << n
								   << "] position adjacency buffer position Reference value is different than the "
									  "rendered data (epsilon "
								   << m_epsilon << " )"
								   << " (" << m_test_data.m_expected_adjacency_geometry[n] << ") vs "
								   << "(" << result_adjacency_geometry_ptr[n] << ")" << tcu::TestLog::EndMessage;

				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
				return STOP;
			}
		}

		sstreamExpected << "]";
		sstreamResult << "]";
		m_testCtx.getLog() << tcu::TestLog::Message << "Adjacency Expected: " << sstreamExpected.str().c_str()
						   << tcu::TestLog::EndMessage;
		m_testCtx.getLog() << tcu::TestLog::Message << "Adjacency Result:  " << sstreamResult.str().c_str()
						   << tcu::TestLog::EndMessage;

		gl.unmapBuffer(GL_TRANSFORM_FEEDBACK_BUFFER);
	}

	/* Read vertex data using TF and compare with expected data*/
	gl.bindBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, m_geometry_bo_id);
	result_geometry_ptr =
		(float*)gl.mapBufferRange(GL_TRANSFORM_FEEDBACK_BUFFER, 0, m_test_data.m_geometry_bo_size, GL_MAP_READ_BIT);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error when mapping data to client space");

	std::stringstream sstreamExpected;
	std::stringstream sstreamResult;
	sstreamExpected << "[";
	sstreamResult << "[";

	for (unsigned int n = 0; n < m_test_data.m_geometry_bo_size / sizeof(float); ++n)
	{
		sstreamExpected << m_test_data.m_expected_geometry[n] << ", ";
		sstreamResult << result_geometry_ptr[n] << ", ";

		if (de::abs(result_geometry_ptr[n] - m_test_data.m_expected_geometry[n]) >= m_epsilon)
		{
			gl.unmapBuffer(GL_TRANSFORM_FEEDBACK_BUFFER);

			m_testCtx.getLog()
				<< tcu::TestLog::Message << "At [" << n
				<< "] position geometry buffer position Reference value is different than the rendered data (epsilon "
				<< m_epsilon << " )"
				<< " (" << m_test_data.m_expected_geometry[n] << ") vs "
				<< "(" << result_geometry_ptr[n] << ")" << tcu::TestLog::EndMessage;

			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
			return STOP;
		}
	}

	sstreamExpected << "]";
	sstreamResult << "]";
	m_testCtx.getLog() << tcu::TestLog::Message << "Expected: " << sstreamExpected.str().c_str()
					   << tcu::TestLog::EndMessage;
	m_testCtx.getLog() << tcu::TestLog::Message << "Result:  " << sstreamResult.str().c_str()
					   << tcu::TestLog::EndMessage;

	gl.unmapBuffer(GL_TRANSFORM_FEEDBACK_BUFFER);

	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	return STOP;
}